

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

ostream * operator<<(ostream *os,cmMakeSafe *self)

{
  char *local_20;
  char *c;
  cmMakeSafe *self_local;
  ostream *os_local;
  
  for (local_20 = self->Data; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '=') {
      std::operator<<(os,"$(EQUALS)");
    }
    else {
      std::operator<<(os,*local_20);
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmMakeSafe const& self)
  {
    for (const char* c = self.Data; *c; ++c) {
      switch (*c) {
        case '=':
          os << "$(EQUALS)";
          break;
        default:
          os << *c;
          break;
      }
    }
    return os;
  }